

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O2

void __thiscall icu_63::PluralFormat::PluralFormat(PluralFormat *this,PluralFormat *other)

{
  Format::Format(&this->super_Format,&other->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__PluralFormat_003ce690;
  Locale::Locale(&this->locale,&other->locale);
  MessagePattern::MessagePattern(&this->msgPattern,&other->msgPattern);
  this->numberFormat = (NumberFormat *)0x0;
  this->offset = other->offset;
  (this->pluralRulesWrapper).super_PluralSelector._vptr_PluralSelector =
       (_func_int **)&PTR__PluralSelectorAdapter_003ce6e8;
  (this->pluralRulesWrapper).pluralRules = (PluralRules *)0x0;
  copyObjects(this,other);
  return;
}

Assistant:

PluralFormat::PluralFormat(const PluralFormat& other)
        : Format(other),
          locale(other.locale),
          msgPattern(other.msgPattern),
          numberFormat(NULL),
          offset(other.offset) {
    copyObjects(other);
}